

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,true>
               (dtime_t *ldata,interval_t *rdata,dtime_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  bool bVar1;
  dtime_t dVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  int64_t *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  interval_t rentry_2;
  dtime_t lentry_2;
  idx_t i;
  interval_t rentry_1;
  dtime_t lentry_1;
  idx_t start;
  interval_t rentry;
  dtime_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffef0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef8;
  dtime_t in_stack_ffffffffffffff00;
  ValidityMask *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  ulong uVar3;
  dtime_t in_stack_ffffffffffffff28;
  idx_t local_a0;
  unsigned_long local_98;
  int64_t local_90;
  int64_t local_88;
  undefined8 local_80;
  int64_t local_78;
  int64_t local_70;
  int64_t local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  int64_t *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 8),in_RDX,(void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (uVar3 = 0; uVar3 < local_20; uVar3 = uVar3 + 1) {
      right_01.micros = uVar3;
      right_01._0_8_ = *(undefined8 *)((long)local_8 + uVar3 * 8);
      in_stack_ffffffffffffff00 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::SubtractTimeOperator,duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                     (SUB81((ulong)local_10[1] >> 0x38,0),in_stack_ffffffffffffff28,right_01,
                      (ValidityMask *)*local_10,in_stack_ffffffffffffff00.micros);
      *(int64_t *)((long)local_18 + uVar3 * 8) = in_stack_ffffffffffffff00.micros;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x12f0479);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_80 = *(undefined8 *)((long)local_8 + local_38 * 8);
          local_90 = *local_10;
          local_88 = local_10[1];
          right.micros = in_stack_ffffffffffffff20;
          right.months = (int)in_stack_ffffffffffffff18;
          right.days = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          local_70 = local_90;
          local_68 = local_88;
          local_60 = local_80;
          local_78 = (int64_t)BinaryStandardOperatorWrapper::
                              Operation<bool,duckdb::SubtractTimeOperator,duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                                        (SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
                                         in_stack_ffffffffffffff28,right,in_stack_ffffffffffffff08,
                                         in_stack_ffffffffffffff00.micros);
          *(int64_t *)((long)local_18 + local_38 * 8) = local_78;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_98 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_a0 = local_38 - local_98;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a0);
            if (bVar1) {
              in_stack_ffffffffffffff28.micros = *local_10;
              right_00.micros = in_stack_ffffffffffffff20;
              right_00.months = (int)in_stack_ffffffffffffff18;
              right_00.days = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
              dVar2 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::SubtractTimeOperator,duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                                (SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
                                 in_stack_ffffffffffffff28,right_00,in_stack_ffffffffffffff08,
                                 in_stack_ffffffffffffff00.micros);
              *(int64_t *)((long)local_18 + local_38 * 8) = dVar2.micros;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}